

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_vertex_element
               (void *dst,float *values,int value_count,nk_draw_vertex_layout_format format)

{
  float fVar1;
  char cVar2;
  short sVar3;
  undefined4 uVar4;
  int iVar5;
  double in_RAX;
  char cVar6;
  short sVar7;
  float *src0;
  bool bVar8;
  bool bVar9;
  char value;
  undefined8 local_38;
  
  src0 = (float *)&local_38;
  if (7 < (uint)value_count) {
    __assert_fail("format < NK_FORMAT_COLOR_BEGIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x24fe,
                  "void nk_draw_vertex_element(void *, const float *, int, enum nk_draw_vertex_layout_format)"
                 );
  }
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  switch((ulong)(uint)value_count) {
  case 0:
    fVar1 = *values;
    cVar6 = '\x7f';
    if (fVar1 < 127.0) {
      cVar6 = (fVar1 < -127.0) * '\x02' + '\x7f';
    }
    cVar2 = (char)(int)fVar1;
    if (127.0 <= fVar1) {
      cVar2 = cVar6;
    }
    if (fVar1 < -127.0) {
      cVar2 = cVar6;
    }
    goto LAB_00141b0b;
  case 1:
    fVar1 = *values;
    sVar3 = (ushort)(fVar1 < -32767.0) * 2 + 0x7fff;
    if (32767.0 <= fVar1) {
      sVar3 = 0x7fff;
    }
    sVar7 = (short)(int)fVar1;
    if (32767.0 <= fVar1) {
      sVar7 = sVar3;
    }
    bVar9 = fVar1 == -32767.0;
    bVar8 = -32767.0 < fVar1;
    goto LAB_00141b8d;
  case 2:
    fVar1 = *values;
    iVar5 = (int)fVar1;
    if (2.1474836e+09 <= fVar1) {
      iVar5 = -0x80000000;
    }
    if (fVar1 < -2.1474836e+09) {
      iVar5 = -0x80000000;
    }
    local_38 = (double)CONCAT44(local_38._4_4_,iVar5);
    break;
  case 3:
    fVar1 = *values;
    cVar2 = (char)(int)fVar1;
    if (256.0 <= fVar1) {
      cVar2 = '\0';
    }
    if (fVar1 < 0.0) {
      cVar2 = '\0';
    }
LAB_00141b0b:
    local_38 = (double)CONCAT71((int7)((ulong)in_RAX >> 8),cVar2);
    nk_memcopy(dst,&local_38,1);
    goto LAB_00141bef;
  case 4:
    fVar1 = *values;
    sVar3 = (fVar1 < 0.0 && fVar1 < 65535.0) - 1;
    sVar7 = (short)(int)fVar1;
    if (65535.0 <= fVar1) {
      sVar7 = sVar3;
    }
    bVar9 = fVar1 == 0.0;
    bVar8 = 0.0 < fVar1;
LAB_00141b8d:
    if (!bVar8 && !bVar9) {
      sVar7 = sVar3;
    }
    local_38 = (double)CONCAT62((int6)((ulong)in_RAX >> 0x10),sVar7);
    nk_memcopy(dst,&local_38,2);
    goto LAB_00141bef;
  case 5:
    fVar1 = *values;
    uVar4 = (int)(long)fVar1;
    if (4.2949673e+09 <= fVar1) {
      uVar4 = 0;
    }
    if (fVar1 < 0.0) {
      uVar4 = 0;
    }
    local_38 = (double)CONCAT44(local_38._4_4_,uVar4);
    src0 = (float *)&local_38;
    break;
  case 6:
    src0 = values;
    local_38 = in_RAX;
    break;
  case 7:
    local_38 = (double)*values;
    nk_memcopy(dst,&local_38,8);
    goto LAB_00141bef;
  }
  nk_memcopy(dst,src0,4);
LAB_00141bef:
  (*(code *)((long)&switchD_00141a56::switchdataD_0015b420 +
            (long)(int)(&switchD_00141a56::switchdataD_0015b420)[(uint)value_count]))();
  return;
}

Assistant:

NK_INTERN void
nk_draw_vertex_element(void *dst, const float *values, int value_count,
    enum nk_draw_vertex_layout_format format)
{
    int value_index;
    void *attribute = dst;
    /* if this triggers you tried to provide a color format for a value */
    NK_ASSERT(format < NK_FORMAT_COLOR_BEGIN);
    if (format >= NK_FORMAT_COLOR_BEGIN && format <= NK_FORMAT_COLOR_END) return;
    for (value_index = 0; value_index < value_count; ++value_index) {
        switch (format) {
        default: NK_ASSERT(0 && "invalid vertex layout format"); break;
        case NK_FORMAT_SCHAR: {
            char value = (char)NK_CLAMP((float)NK_SCHAR_MIN, values[value_index], (float)NK_SCHAR_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(char));
        } break;
        case NK_FORMAT_SSHORT: {
            nk_short value = (nk_short)NK_CLAMP((float)NK_SSHORT_MIN, values[value_index], (float)NK_SSHORT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(value));
        } break;
        case NK_FORMAT_SINT: {
            nk_int value = (nk_int)NK_CLAMP((float)NK_SINT_MIN, values[value_index], (float)NK_SINT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(nk_int));
        } break;
        case NK_FORMAT_UCHAR: {
            unsigned char value = (unsigned char)NK_CLAMP((float)NK_UCHAR_MIN, values[value_index], (float)NK_UCHAR_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(unsigned char));
        } break;
        case NK_FORMAT_USHORT: {
            nk_ushort value = (nk_ushort)NK_CLAMP((float)NK_USHORT_MIN, values[value_index], (float)NK_USHORT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(value));
            } break;
        case NK_FORMAT_UINT: {
            nk_uint value = (nk_uint)NK_CLAMP((float)NK_UINT_MIN, values[value_index], (float)NK_UINT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(nk_uint));
        } break;
        case NK_FORMAT_FLOAT:
            NK_MEMCPY(attribute, &values[value_index], sizeof(values[value_index]));
            attribute = (void*)((char*)attribute + sizeof(float));
            break;
        case NK_FORMAT_DOUBLE: {
            double value = (double)values[value_index];
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(double));
            } break;
        }
    }
}